

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

ostream * doctest::detail::getTlsOss(bool reset)

{
  long lVar1;
  ostream *poVar2;
  undefined7 in_register_00000039;
  long *in_FS_OFFSET;
  allocator<char> local_39;
  string local_38 [32];
  
  if ((int)CONCAT71(in_register_00000039,reset) == 0) {
    poVar2 = (ostream *)(*in_FS_OFFSET + -0x1b8);
  }
  else {
    g_infoContexts::__tls_init();
    lVar1 = *in_FS_OFFSET;
    poVar2 = (ostream *)(lVar1 + -0x1b8);
    std::ios::clear((int)*(undefined8 *)(in_FS_OFFSET[-0x37] + -0x18) + (int)poVar2);
    g_infoContexts::__tls_init();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"",&local_39);
    std::__cxx11::stringbuf::str((string *)(lVar1 + -0x1b0));
    std::__cxx11::string::~string(local_38);
  }
  g_infoContexts::__tls_init();
  return poVar2;
}

Assistant:

std::ostream* getTlsOss(bool reset) {
        if(reset) {
          g_oss.clear(); // there shouldn't be anything worth clearing in the flags
          g_oss.str(""); // the slow way of resetting a string stream
          //g_oss.seekp(0); // optimal reset - as seen here: https://stackoverflow.com/a/624291/3162383
	}
        return &g_oss;
    }